

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web_peer_connection.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::web_peer_connection::write_request(web_peer_connection *this,peer_request *r)

{
  _Atomic_word *p_Var1;
  iterator *piVar2;
  iterator *piVar3;
  uint uVar4;
  torrent_info *this_00;
  _Elt_pointer ppVar5;
  web_seed_t *pwVar6;
  session_settings *psVar7;
  _Elt_pointer pfVar8;
  _Map_pointer ppfVar9;
  io_context *piVar10;
  span<const_char> buf;
  int64_t iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  string *psVar15;
  file_storage *pfVar16;
  _Rb_tree_header *p_Var17;
  file_index_t index;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Base_ptr p_Var18;
  _Base_ptr p_Var19;
  ulong uVar20;
  byte bVar21;
  element_type *peVar22;
  int iVar23;
  int iVar24;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var25;
  uint *puVar26;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var27;
  bool bVar28;
  peer_request pr;
  uint local_d0;
  file_request_t file_req_1;
  file_request_t file_req;
  long local_a0;
  string request;
  undefined1 local_70 [8];
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  long local_48;
  element_type *local_40;
  vector<char> *local_38;
  
  peVar22 = (this->super_web_connection_base).super_peer_connection.
            super_peer_connection_hot_members.m_torrent.
            super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var27 = (this->super_web_connection_base).super_peer_connection.
            super_peer_connection_hot_members.m_torrent.
            super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  p_Var25 = p_Var27;
  if (p_Var27 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var27->_M_weak_count = p_Var27->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Var27->_M_weak_count = p_Var27->_M_weak_count + 1;
    }
    if (p_Var27 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar13 = p_Var27->_M_use_count;
      do {
        p_Var25 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (iVar13 == 0) break;
        LOCK();
        iVar14 = p_Var27->_M_use_count;
        bVar28 = iVar13 == iVar14;
        if (bVar28) {
          p_Var27->_M_use_count = iVar13 + 1;
          iVar14 = iVar13;
        }
        iVar13 = iVar14;
        UNLOCK();
        p_Var25 = p_Var27;
      } while (!bVar28);
    }
  }
  if (p_Var25 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    peVar22 = (element_type *)0x0;
  }
  else if (p_Var25->_M_use_count == 0) {
    peVar22 = (element_type *)0x0;
  }
  if (p_Var27 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var27->_M_weak_count;
      iVar13 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar13 = p_Var27->_M_weak_count;
      p_Var27->_M_weak_count = iVar13 + -1;
    }
    if (iVar13 == 1) {
      (*p_Var27->_vptr__Sp_counted_base[3])();
    }
  }
  this_00 = (peVar22->super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_48 = (long)(r->piece).m_val;
  iVar13 = r->start;
  local_d0 = r->length;
  request._M_dataplus._M_p = (pointer)&request.field_2;
  request._M_string_length = 0;
  request.field_2._M_local_buf[0] = '\0';
  local_50 = p_Var25;
  ::std::__cxx11::string::reserve((ulong)&request);
  iVar14 = (((peVar22->super_torrent_hot_members).m_torrent_file.
             super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           m_files).m_piece_length;
  iVar24 = 0x4000;
  if (iVar14 < 0x4000) {
    iVar24 = iVar14;
  }
  if (iVar14 < 1) {
    iVar24 = 0x4000;
  }
  pr.length = 0;
  pr.piece.m_val = 0;
  pr.start = 0;
  local_40 = peVar22;
  if (0 < r->length) {
    local_38 = &this->m_piece;
    iVar23 = r->length;
    do {
      iVar12 = (r->start - iVar23) + r->length;
      pr.start = iVar12 % iVar14;
      pr.length = iVar24;
      if (iVar23 < iVar24) {
        pr.length = iVar23;
      }
      if (iVar14 - pr.start < pr.length) {
        pr.length = iVar14 - pr.start;
      }
      pr.piece.m_val = iVar12 / iVar14 + (r->piece).m_val;
      ppVar5 = (this->super_web_connection_base).m_requests.
               super__Deque_base<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppVar5 == (this->super_web_connection_base).m_requests.
                    super__Deque_base<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        ::std::deque<libtorrent::peer_request,std::allocator<libtorrent::peer_request>>::
        _M_push_back_aux<libtorrent::peer_request_const&>
                  ((deque<libtorrent::peer_request,std::allocator<libtorrent::peer_request>> *)
                   &(this->super_web_connection_base).m_requests,&pr);
      }
      else {
        ppVar5->length = pr.length;
        ppVar5->piece = (piece_index_t)pr.piece.m_val;
        ppVar5->start = pr.start;
        piVar2 = &(this->super_web_connection_base).m_requests.
                  super__Deque_base<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                  ._M_impl.super__Deque_impl_data._M_finish;
        piVar2->_M_cur = piVar2->_M_cur + 1;
      }
      pwVar6 = this->m_web;
      ppVar5 = (this->super_web_connection_base).m_requests.
               super__Deque_base<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      if ((((pwVar6->restart_request).piece.m_val == (ppVar5->piece).m_val) &&
          ((pwVar6->restart_request).start == ppVar5->start)) &&
         ((pwVar6->restart_request).length == ppVar5->length)) {
        ::std::vector<char,_std::allocator<char>_>::_M_move_assign
                  (&local_38->super_vector<char,_std::allocator<char>_>,&pwVar6->restart_piece);
        ppVar5 = (this->super_web_connection_base).m_requests.
                 super__Deque_base<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        peer_connection::peer_log
                  ((peer_connection *)this,info,"RESTART_DATA","data: %d req: (%d, %d) size: %d",
                   (ulong)(uint)(*(int *)&(this->m_piece).super_vector<char,_std::allocator<char>_>.
                                          super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                          super__Vector_impl_data._M_finish -
                                *(int *)&(this->m_piece).super_vector<char,_std::allocator<char>_>.
                                         super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                         super__Vector_impl_data._M_start),
                   (ulong)(uint)(ppVar5->piece).m_val,(ulong)(uint)ppVar5->start,
                   (ulong)((ppVar5->start + ppVar5->length) - 1));
        iVar12 = *(int *)&(this->m_piece).super_vector<char,_std::allocator<char>_>.
                          super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                 *(int *)&(this->m_piece).super_vector<char,_std::allocator<char>_>.
                          super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start;
        peer_connection::incoming_piece_fragment((peer_connection *)this,iVar12);
        local_d0 = local_d0 - iVar12;
        iVar13 = iVar13 + iVar12;
        (this->m_web->restart_request).piece.m_val = -1;
      }
      iVar12 = iVar23 - pr.length;
      bVar28 = pr.length <= iVar23;
      iVar23 = iVar12;
    } while (iVar12 != 0 && bVar28);
  }
  peer_connection::peer_log
            ((peer_connection *)this,outgoing_message,"REQUESTING",
             "(piece: %d start: %d) - (piece: %d end: %d)",(ulong)(uint)(r->piece).m_val,
             (ulong)(uint)r->start,pr._0_8_ & 0xffffffff,(ulong)(uint)(pr.length + pr.start));
  iVar14 = file_storage::num_files
                     (&((local_40->super_torrent_hot_members).m_torrent_file.
                        super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->m_files);
  psVar7 = (this->super_web_connection_base).super_peer_connection.super_peer_connection_hot_members
           .m_settings;
  local_70 = (undefined1  [8])&psVar7->m_mutex;
  local_68 = local_68 & 0xffffffffffffff00;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_70);
  local_68 = CONCAT71(local_68._1_7_,true);
  uVar4 = (psVar7->m_store).m_ints._M_elems[0x7b];
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_70);
  p_Var27 = local_50;
  bVar21 = ((this->super_web_connection_base).super_peer_connection.field_0x889 ^ 1) &
           (uVar4 & 0xfffffffe) == 4;
  if (iVar14 == 1) {
    file_req.start = (long)iVar13 + (this_00->m_files).m_piece_length * local_48;
    file_req._0_8_ = (ulong)local_d0 << 0x20;
    ::std::__cxx11::string::append((char *)&request);
    psVar15 = &(this->super_web_connection_base).m_path;
    if (bVar21 != 0) {
      psVar15 = &this->m_url;
    }
    ::std::__cxx11::string::_M_append((char *)&request,(ulong)(psVar15->_M_dataplus)._M_p);
    ::std::__cxx11::string::append((char *)&request);
    (*(this->super_web_connection_base).super_peer_connection.super_bandwidth_socket.
      _vptr_bandwidth_socket[0x36])
              (this,&request,
               (this->super_web_connection_base).super_peer_connection.
               super_peer_connection_hot_members.m_settings,(ulong)bVar21);
    ::std::__cxx11::string::append((char *)&request);
    to_string((array<char,_22UL> *)local_70,file_req.start);
    ::std::__cxx11::string::append((char *)&request);
    ::std::__cxx11::string::append((char *)&request);
    to_string((array<char,_22UL> *)local_70,file_req.start + file_req.length + -1);
    ::std::__cxx11::string::append((char *)&request);
    ::std::__cxx11::string::append((char *)&request);
    (this->super_web_connection_base).super_peer_connection.field_0x888 = 0;
    pfVar8 = (this->m_file_requests).
             super__Deque_base<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pfVar8 == (this->m_file_requests).
                  super__Deque_base<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      ::std::
      deque<libtorrent::aux::web_peer_connection::file_request_t,std::allocator<libtorrent::aux::web_peer_connection::file_request_t>>
      ::_M_push_back_aux<libtorrent::aux::web_peer_connection::file_request_t_const&>
                ((deque<libtorrent::aux::web_peer_connection::file_request_t,std::allocator<libtorrent::aux::web_peer_connection::file_request_t>>
                  *)&this->m_file_requests,&file_req);
    }
    else {
      pfVar8->file_index = (file_index_t)file_req.file_index.m_val;
      pfVar8->length = file_req.length;
      pfVar8->start = file_req.start;
      piVar3 = &(this->m_file_requests).
                super__Deque_base<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar3->_M_cur = piVar3->_M_cur + 1;
    }
    iVar13 = 0;
  }
  else {
    pfVar16 = torrent_info::orig_files(this_00);
    file_storage::map_block
              ((vector<libtorrent::file_slice,_std::allocator<libtorrent::file_slice>_> *)&file_req,
               pfVar16,(piece_index_t)(int)local_48,(long)iVar13,(long)(int)local_d0);
    iVar11 = file_req.start;
    if (file_req._0_8_ == file_req.start) {
      iVar13 = 0;
    }
    else {
      iVar13 = 0;
      puVar26 = (uint *)file_req._0_8_;
      do {
        file_req_1.file_index.m_val = *puVar26;
        file_req_1.start = *(int64_t *)(puVar26 + 2);
        file_req_1.length = puVar26[4];
        pfVar16 = torrent_info::orig_files(this_00);
        bVar28 = file_storage::pad_file_at(pfVar16,(file_index_t)*puVar26);
        if (bVar28) {
          pfVar8 = (this->m_file_requests).
                   super__Deque_base<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (pfVar8 == (this->m_file_requests).
                        super__Deque_base<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            ::std::
            deque<libtorrent::aux::web_peer_connection::file_request_t,std::allocator<libtorrent::aux::web_peer_connection::file_request_t>>
            ::_M_push_back_aux<libtorrent::aux::web_peer_connection::file_request_t_const&>
                      ((deque<libtorrent::aux::web_peer_connection::file_request_t,std::allocator<libtorrent::aux::web_peer_connection::file_request_t>>
                        *)&this->m_file_requests,&file_req_1);
          }
          else {
            pfVar8->file_index = (file_index_t)file_req_1.file_index.m_val;
            pfVar8->length = file_req_1.length;
            pfVar8->start = file_req_1.start;
            piVar3 = &(this->m_file_requests).
                      super__Deque_base<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
                      ._M_impl.super__Deque_impl_data._M_finish;
            piVar3->_M_cur = piVar3->_M_cur + 1;
          }
          iVar13 = iVar13 + 1;
        }
        else {
          ::std::__cxx11::string::append((char *)&request);
          if (bVar21 != 0) {
            ::std::__cxx11::string::_M_append
                      ((char *)&request,(ulong)(this->m_url)._M_dataplus._M_p);
          }
          p_Var19 = (this->m_web->redirects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var17 = &(this->m_web->redirects)._M_t._M_impl.super__Rb_tree_header;
          p_Var18 = &p_Var17->_M_header;
          if (p_Var19 != (_Base_ptr)0x0) {
            do {
              if ((int)*puVar26 <= (int)p_Var19[1]._M_color) {
                p_Var18 = p_Var19;
              }
              p_Var19 = (&p_Var19->_M_left)[(int)p_Var19[1]._M_color < (int)*puVar26];
            } while (p_Var19 != (_Base_ptr)0x0);
          }
          p_Var19 = &p_Var17->_M_header;
          if (((_Rb_tree_header *)p_Var18 != p_Var17) &&
             (p_Var19 = p_Var18, (int)*puVar26 < (int)p_Var18[1]._M_color)) {
            p_Var18 = &p_Var17->_M_header;
            p_Var19 = &p_Var17->_M_header;
          }
          index.m_val = (int)p_Var18;
          if ((_Rb_tree_header *)p_Var19 == p_Var17) {
            if (bVar21 == 0) {
              ::std::__cxx11::string::_M_append
                        ((char *)&request,
                         (ulong)(this->super_web_connection_base).m_path._M_dataplus._M_p);
            }
            pfVar16 = torrent_info::orig_files(this_00);
            escape_file_path_abi_cxx11_
                      ((string *)local_70,(aux *)pfVar16,(file_storage *)(ulong)*puVar26,index);
            ::std::__cxx11::string::_M_append((char *)&request,(ulong)local_70);
            if (local_70 != (undefined1  [8])&local_60) {
              operator_delete((void *)local_70,local_60._M_allocated_capacity + 1);
            }
          }
          else {
            if ((bVar21 == 0) || (p_Var19[1]._M_left == (_Base_ptr)0x0)) {
              uVar20 = 0;
            }
            else {
              uVar20 = (ulong)((char)(p_Var19[1]._M_parent)->_M_color == 0x2f);
            }
            ::std::__cxx11::string::append((string *)&request,(ulong)&p_Var19[1]._M_parent,uVar20);
          }
          ::std::__cxx11::string::append((char *)&request);
          (*(this->super_web_connection_base).super_peer_connection.super_bandwidth_socket.
            _vptr_bandwidth_socket[0x36])
                    (this,&request,
                     (this->super_web_connection_base).super_peer_connection.
                     super_peer_connection_hot_members.m_settings,(ulong)bVar21);
          ::std::__cxx11::string::append((char *)&request);
          to_string((array<char,_22UL> *)local_70,*(int64_t *)(puVar26 + 2));
          ::std::__cxx11::string::append((char *)&request);
          ::std::__cxx11::string::append((char *)&request);
          to_string((array<char,_22UL> *)local_70,
                    *(long *)(puVar26 + 2) + *(long *)(puVar26 + 4) + -1);
          ::std::__cxx11::string::append((char *)&request);
          ::std::__cxx11::string::append((char *)&request);
          (this->super_web_connection_base).super_peer_connection.field_0x888 = 0;
          pfVar8 = (this->m_file_requests).
                   super__Deque_base<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (pfVar8 == (this->m_file_requests).
                        super__Deque_base<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            ::std::
            deque<libtorrent::aux::web_peer_connection::file_request_t,std::allocator<libtorrent::aux::web_peer_connection::file_request_t>>
            ::_M_push_back_aux<libtorrent::aux::web_peer_connection::file_request_t_const&>
                      ((deque<libtorrent::aux::web_peer_connection::file_request_t,std::allocator<libtorrent::aux::web_peer_connection::file_request_t>>
                        *)&this->m_file_requests,&file_req_1);
          }
          else {
            pfVar8->file_index = (file_index_t)file_req_1.file_index.m_val;
            pfVar8->length = file_req_1.length;
            pfVar8->start = file_req_1.start;
            piVar3 = &(this->m_file_requests).
                      super__Deque_base<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
                      ._M_impl.super__Deque_impl_data._M_finish;
            piVar3->_M_cur = piVar3->_M_cur + 1;
          }
        }
        puVar26 = puVar26 + 6;
      } while (puVar26 != (uint *)iVar11);
    }
    p_Var27 = local_50;
    if (file_req._0_8_ != 0) {
      operator_delete((void *)file_req._0_8_,local_a0 - file_req._0_8_);
      p_Var27 = local_50;
    }
  }
  ppfVar9 = (this->m_file_requests).
            super__Deque_base<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  if (iVar13 == (int)((ulong)((long)(this->m_file_requests).
                                    super__Deque_base<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_last -
                             (long)(this->m_file_requests).
                                   super__Deque_base<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
                                   ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 4) +
                (int)((ulong)((long)(this->m_file_requests).
                                    super__Deque_base<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
                                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                             (long)(this->m_file_requests).
                                   super__Deque_base<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
                                   ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 4) +
                ((((uint)((int)ppfVar9 -
                         *(int *)&(this->m_file_requests).
                                  super__Deque_base<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                (uint)(ppfVar9 == (_Map_pointer)0x0)) * 0x20) {
    piVar10 = (this->super_web_connection_base).super_peer_connection.m_ios;
    ::std::__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libtorrent::aux::peer_connection,void>
              ((__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2> *)
               &file_req_1,
               (__weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> *)
               &(this->super_web_connection_base).super_peer_connection.
                super_enable_shared_from_this<libtorrent::aux::peer_connection>);
    local_60._M_allocated_capacity = CONCAT44(file_req_1.length,file_req_1.file_index.m_val);
    if (file_req_1.start != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(file_req_1.start + 8) = *(int *)(file_req_1.start + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(file_req_1.start + 8) = *(int *)(file_req_1.start + 8) + 1;
      }
    }
    local_70 = (undefined1  [8])on_receive_padfile;
    local_68 = 0;
    local_60._8_8_ = file_req_1.start;
    file_req.start = CONCAT44(1,(undefined4)file_req.start);
    file_req._0_8_ = piVar10;
    boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>::
    execute<std::_Bind<void(libtorrent::aux::web_peer_connection::*(std::shared_ptr<libtorrent::aux::web_peer_connection>))()>>
              ((basic_executor_type<std::allocator<void>,0u> *)&file_req,
               (_Bind<void_(libtorrent::aux::web_peer_connection::*(std::shared_ptr<libtorrent::aux::web_peer_connection>))()>
                *)local_70);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
    }
    if (file_req_1.start != 0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)file_req_1.start);
    }
  }
  else {
    peer_connection::peer_log
              ((peer_connection *)this,outgoing_message,"REQUEST","%s",request._M_dataplus._M_p);
    buf.m_len = request._M_string_length;
    buf.m_ptr = request._M_dataplus._M_p;
    peer_connection::send_buffer((peer_connection *)this,buf);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)request._M_dataplus._M_p != &request.field_2) {
    operator_delete(request._M_dataplus._M_p,
                    CONCAT71(request.field_2._M_allocated_capacity._1_7_,
                             request.field_2._M_local_buf[0]) + 1);
  }
  if (p_Var27 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var27);
  }
  return;
}

Assistant:

void web_peer_connection::write_request(peer_request const& r)
{
	INVARIANT_CHECK;

	auto t = associated_torrent().lock();
	TORRENT_ASSERT(t);

	TORRENT_ASSERT(t->valid_metadata());

	torrent_info const& info = t->torrent_file();
	peer_request req = r;

	std::string request;
	request.reserve(400);

	int size = r.length;
	const int block_size = t->block_size();
	const int piece_size = t->torrent_file().piece_length();
	peer_request pr{};

	while (size > 0)
	{
		int request_offset = r.start + r.length - size;
		pr.start = request_offset % piece_size;
		pr.length = std::min(std::min(block_size, size), piece_size - pr.start);
		pr.piece = piece_index_t(static_cast<int>(r.piece) + request_offset / piece_size);
		TORRENT_ASSERT(validate_piece_request(pr));
		m_requests.push_back(pr);

		if (m_web->restart_request == m_requests.front())
		{
			TORRENT_ASSERT(int(m_piece.size()) == m_received_in_piece);
			TORRENT_ASSERT(m_piece.empty());
			m_piece = std::move(m_web->restart_piece);
			peer_request const& front = m_requests.front();
			TORRENT_ASSERT(front.length > int(m_piece.size()));

#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "RESTART_DATA",
				"data: %d req: (%d, %d) size: %d"
					, int(m_piece.size()), static_cast<int>(front.piece), front.start
					, front.start + front.length - 1);
#else
			TORRENT_UNUSED(front);
#endif

			req.start += int(m_piece.size());
			req.length -= int(m_piece.size());

			// just to keep the accounting straight for the upper layer.
			// it doesn't know we just re-wrote the request
			incoming_piece_fragment(int(m_piece.size()));
			m_web->restart_request.piece = piece_index_t(-1);

			TORRENT_ASSERT(int(m_piece.size()) == m_received_in_piece);
		}

#if 0
			std::cerr << this << " REQ: p: " << pr.piece << " " << pr.start << std::endl;
#endif
		size -= pr.length;
	}

#ifndef TORRENT_DISABLE_LOGGING
	peer_log(peer_log_alert::outgoing_message, "REQUESTING", "(piece: %d start: %d) - (piece: %d end: %d)"
		, static_cast<int>(r.piece), r.start
		, static_cast<int>(pr.piece), pr.start + pr.length);
#endif

	bool const single_file_request = t->torrent_file().num_files() == 1;
	int const proxy_type = m_settings.get_int(settings_pack::proxy_type);
	bool const using_proxy = (proxy_type == settings_pack::http
		|| proxy_type == settings_pack::http_pw) && !m_ssl;

	// the number of pad files that have been "requested". In case we _only_
	// request padfiles, we can't rely on handling them in the on_receive()
	// callback (because we won't receive anything), instead we have to post a
	// pretend read callback where we can deliver the zeroes for the partfile
	int num_pad_files = 0;

	// TODO: 3 do we really need a special case here? wouldn't the multi-file
	// case handle single file torrents correctly too?
	if (single_file_request)
	{
		file_request_t file_req;
		file_req.file_index = file_index_t(0);
		file_req.start = std::int64_t(static_cast<int>(req.piece)) * info.piece_length()
			+ req.start;
		file_req.length = req.length;

		request += "GET ";
		// do not encode single file paths, they are
		// assumed to be encoded in the torrent file
		request += using_proxy ? m_url : m_path;
		request += " HTTP/1.1\r\n";
		add_headers(request, m_settings, using_proxy);
		request += "\r\nRange: bytes=";
		request += to_string(file_req.start).data();
		request += "-";
		request += to_string(file_req.start + file_req.length - 1).data();
		request += "\r\n\r\n";
		m_first_request = false;

		m_file_requests.push_back(file_req);
	}
	else
	{
		std::vector<file_slice> files = info.orig_files().map_block(req.piece, req.start
			, req.length);

		for (auto const &f : files)
		{
			file_request_t file_req;
			file_req.file_index = f.file_index;
			file_req.start = f.offset;
			file_req.length = int(f.size);

			if (info.orig_files().pad_file_at(f.file_index))
			{
				m_file_requests.push_back(file_req);
				++num_pad_files;
				continue;
			}

			request += "GET ";
			if (using_proxy)
			{
				// m_url is already a properly escaped URL
				// with the correct slashes. Don't encode it again
				request += m_url;
			}

			auto redirection = m_web->redirects.find(f.file_index);
			if (redirection != m_web->redirects.end())
			{
				auto const& redirect = redirection->second;
				// in case of http proxy "request" already contains m_url with trailing slash, so let's skip dup slash
				bool const trailing_slash = using_proxy && !redirect.empty() && redirect[0] == '/';
				request.append(redirect, trailing_slash, std::string::npos);
			}
			else
			{
				if (!using_proxy)
				{
					// m_path is already a properly escaped URL
					// with the correct slashes. Don't encode it again
					request += m_path;
				}

				request += escape_file_path(info.orig_files(), f.file_index);
			}
			request += " HTTP/1.1\r\n";
			add_headers(request, m_settings, using_proxy);
			request += "\r\nRange: bytes=";
			request += to_string(f.offset).data();
			request += "-";
			request += to_string(f.offset + f.size - 1).data();
			request += "\r\n\r\n";
			m_first_request = false;

#if 0
			std::cerr << this << " SEND-REQUEST: f: " << f.file_index
				<< " s: " << f.offset
				<< " e: " << (f.offset + f.size - 1) << std::endl;
#endif
			// TODO: 3 file_index_t should not allow negative values
			TORRENT_ASSERT(f.file_index >= file_index_t(0));

			m_file_requests.push_back(file_req);
		}
	}

	if (num_pad_files == int(m_file_requests.size()))
	{
		post(get_context(), std::bind(
			&web_peer_connection::on_receive_padfile,
			std::static_pointer_cast<web_peer_connection>(self())));
		return;
	}

#ifndef TORRENT_DISABLE_LOGGING
	peer_log(peer_log_alert::outgoing_message, "REQUEST", "%s", request.c_str());
#endif

	send_buffer(request);
}